

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

void Abc_TtAndSharp(word *pOut,word *pIn1,word *pIn2,int nWords,int fCompl)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  if (0 < nWords) {
    uVar1 = (ulong)(uint)nWords;
  }
  uVar2 = 0;
  if (fCompl == 0) {
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      pOut[uVar2] = pIn2[uVar2] & pIn1[uVar2];
    }
  }
  else {
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      pOut[uVar2] = ~pIn2[uVar2] & pIn1[uVar2];
    }
  }
  return;
}

Assistant:

static inline void Abc_TtAndSharp( word * pOut, word * pIn1, word * pIn2, int nWords, int fCompl )
{
    int w;
    if ( fCompl )
        for ( w = 0; w < nWords; w++ )
            pOut[w] = pIn1[w] & ~pIn2[w];
    else
        for ( w = 0; w < nWords; w++ )
            pOut[w] = pIn1[w] & pIn2[w];
}